

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintDebugDataKSZ(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  ushort uVar1;
  bool bVar2;
  ostream *poVar3;
  allocator<char> local_49;
  double local_48;
  string local_40;
  
  local_48 = clockPeriod;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"PrintDebugDataKSZ",&local_49);
  bVar2 = CheckDebugHeader(debugStream,&local_40,(char *)data,2);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar2) {
    std::operator<<(debugStream,"*** KSZ: ");
    uVar1 = *(ushort *)((long)data + 6);
    if ((short)uVar1 < 0) {
      std::operator<<(debugStream,"isDMAWrite ");
      uVar1 = *(ushort *)((long)data + 6);
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      std::operator<<(debugStream,"sendRequest ");
      uVar1 = *(ushort *)((long)data + 6);
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      std::operator<<(debugStream,"IRQ ");
      uVar1 = *(ushort *)((long)data + 6);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      std::operator<<(debugStream,"isInIRQ ");
      uVar1 = *(ushort *)((long)data + 6);
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      std::operator<<(debugStream,"link-on ");
    }
    std::endl<char,std::char_traits<char>>(debugStream);
    poVar3 = std::operator<<(debugStream,"State: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0xb));
    poVar3 = std::operator<<(poVar3,", nextState: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 9));
    poVar3 = std::operator<<(poVar3,", retState: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 10));
    poVar3 = std::operator<<(poVar3,", PC: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(byte)data[2]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"RegISROther: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[3]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"FrameCount: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x11));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numReset: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x1f));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numPacketValid: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[7]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numPacketInvalid: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x1e));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numPacketSent: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(byte)data[4]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"rxPktWords: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[5]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"txPktWords: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x16));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"respBytes: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0xe));
    std::endl<char,std::char_traits<char>>(poVar3);
    local_48 = local_48 * 1000000.0;
    std::operator<<(debugStream,"timeReceive (us): ");
    poVar3 = std::ostream::_M_insert<double>((double)(ushort)data[6] * local_48);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(debugStream,"timeSend (us): ");
    poVar3 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0x1a) * local_48);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"bw_wait: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x12));
    std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0x12) * local_48);
    poVar3 = std::operator<<(poVar3," us)");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugDataKSZ(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in KSZ8851.v
    struct DebugData {
        char     header[4];        // Quad 0
        uint16_t quad1_low;        // Quad 1
        uint16_t statusbits;
        uint8_t  runPC;            // Quad 2
        uint8_t  nextState;
        uint8_t  retState;
        uint8_t  state;
        uint16_t regISROther;      // Quad 3
        uint16_t respBytes;
        uint8_t  numPacketSent;    // Quad 4
        uint8_t  frameCount;
        uint16_t bw_wait;
        uint16_t rxPktWords;      // Quad 5
        uint16_t txPktWords;
        uint16_t timeReceive;     // Quad 6
        uint16_t timeSend;
        uint16_t numPacketValid;  // Quad 7
        uint8_t  numPacketInvalid;
        uint8_t  numReset;
        uint32_t unused[8];       // Unused (except if DEBOUNCE_STATES)
    };
    if (sizeof(DebugData) != 16*sizeof(quadlet_t)) {
        debugStream << "PrintDebugDataKSZ: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugDataKSZ", p->header, 2))
        return;

    debugStream << "*** KSZ: ";
    if (p->statusbits & 0x8000) debugStream << "isDMAWrite ";
    if (p->statusbits & 0x4000) debugStream << "sendRequest ";
    if (p->statusbits & 0x2000) debugStream << "IRQ ";
    if (p->statusbits & 0x1000) debugStream << "isInIRQ ";
    if (p->statusbits & 0x0800) debugStream << "link-on ";
    debugStream << std::endl;
    debugStream << "State: " << static_cast<uint16_t>(p->state)
                << ", nextState: " << static_cast<uint16_t>(p->nextState)
                << ", retState: " << static_cast<uint16_t> (p->retState)
                << ", PC: " << static_cast<uint16_t>(p->runPC) << std::endl;
    debugStream << "RegISROther: " << std::hex << p->regISROther << std::endl;
    debugStream << "FrameCount: " << std::dec << static_cast<uint16_t>(p->frameCount) << std::endl;
    debugStream << "numReset: " << std::dec << static_cast<uint16_t>(p->numReset) << std::endl;
    debugStream << "numPacketValid: " << std::dec << p->numPacketValid << std::endl;
    debugStream << "numPacketInvalid: " << std::dec << static_cast<uint16_t>(p->numPacketInvalid) << std::endl;
    debugStream << "numPacketSent: " << std::dec << static_cast<uint16_t>(p->numPacketSent) << std::endl;
    debugStream << "rxPktWords: " << std::dec << p->rxPktWords << std::endl;
    debugStream << "txPktWords: " << std::dec << p->txPktWords << std::endl;
    debugStream << "respBytes: " << p->respBytes << std::endl;
    const double bits2uS = clockPeriod*1e6;
    debugStream << "timeReceive (us): " << p->timeReceive*bits2uS << std::endl;
    debugStream << "timeSend (us): " << p->timeSend*bits2uS << std::endl;
    debugStream << "bw_wait: " << std::dec << p->bw_wait << " (" << p->bw_wait*bits2uS << " us)" << std::endl;
}